

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.cpp
# Opt level: O0

void UpdatePSBTOutput(SigningProvider *provider,PartiallySignedTransaction *psbt,int index)

{
  long lVar1;
  SignatureData *sigdata_00;
  reference amount;
  reference pvVar2;
  undefined4 in_EDX;
  MutableTransactionSignatureCreator *in_RSI;
  long in_FS_OFFSET;
  PSBTOutput *psbt_out;
  CTxOut *out;
  CMutableTransaction *tx;
  MutableTransactionSignatureCreator creator;
  SignatureData sigdata;
  SignatureData *in_stack_fffffffffffffbc8;
  size_type in_stack_fffffffffffffbd0;
  vector<CTxOut,_std::allocator<CTxOut>_> *in_stack_fffffffffffffbd8;
  char *in_stack_fffffffffffffbe8;
  int hash_type;
  char *in_stack_fffffffffffffbf0;
  undefined8 in_stack_fffffffffffffbf8;
  undefined4 in_stack_fffffffffffffc00;
  SignatureData *in_stack_fffffffffffffc58;
  PSBTOutput *in_stack_fffffffffffffc60;
  SignatureData *in_stack_fffffffffffffce0;
  CScript *in_stack_fffffffffffffce8;
  BaseSignatureCreator *in_stack_fffffffffffffcf0;
  SigningProvider *in_stack_fffffffffffffcf8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::optional<CMutableTransaction>&>
            ((optional<CMutableTransaction> *)in_RSI,
             (char *)CONCAT44(in_EDX,in_stack_fffffffffffffc00),
             (int)((ulong)in_stack_fffffffffffffbf8 >> 0x20),in_stack_fffffffffffffbf0,
             in_stack_fffffffffffffbe8);
  sigdata_00 = (SignatureData *)
               std::optional<CMutableTransaction>::operator*
                         ((optional<CMutableTransaction> *)in_stack_fffffffffffffbc8);
  amount = std::vector<CTxOut,_std::allocator<CTxOut>_>::at
                     (in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  pvVar2 = std::vector<PSBTOutput,_std::allocator<PSBTOutput>_>::at
                     ((vector<PSBTOutput,_std::allocator<PSBTOutput>_> *)in_stack_fffffffffffffbd8,
                      in_stack_fffffffffffffbd0);
  hash_type = (int)((ulong)pvVar2 >> 0x20);
  SignatureData::SignatureData(in_stack_fffffffffffffc58);
  PSBTOutput::FillSignatureData(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
  MutableTransactionSignatureCreator::MutableTransactionSignatureCreator
            (in_RSI,(CMutableTransaction *)CONCAT44(in_EDX,in_stack_fffffffffffffc00),
             (uint)((ulong)sigdata_00 >> 0x20),&amount->nValue,hash_type);
  ProduceSignature(in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,
                   in_stack_fffffffffffffce0);
  PSBTOutput::FromSignatureData((PSBTOutput *)CONCAT44(in_EDX,in_stack_fffffffffffffc00),sigdata_00)
  ;
  SignatureData::~SignatureData(in_stack_fffffffffffffbc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void UpdatePSBTOutput(const SigningProvider& provider, PartiallySignedTransaction& psbt, int index)
{
    CMutableTransaction& tx = *Assert(psbt.tx);
    const CTxOut& out = tx.vout.at(index);
    PSBTOutput& psbt_out = psbt.outputs.at(index);

    // Fill a SignatureData with output info
    SignatureData sigdata;
    psbt_out.FillSignatureData(sigdata);

    // Construct a would-be spend of this output, to update sigdata with.
    // Note that ProduceSignature is used to fill in metadata (not actual signatures),
    // so provider does not need to provide any private keys (it can be a HidingSigningProvider).
    MutableTransactionSignatureCreator creator(tx, /*input_idx=*/0, out.nValue, SIGHASH_ALL);
    ProduceSignature(provider, creator, out.scriptPubKey, sigdata);

    // Put redeem_script, witness_script, key paths, into PSBTOutput.
    psbt_out.FromSignatureData(sigdata);
}